

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

void __thiscall Catch::clara::TextFlow::Columns::iterator::iterator(iterator *this,Columns *columns)

{
  vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_> *this_00;
  bool bVar1;
  size_type sVar2;
  iterator local_78;
  reference local_48;
  Column *col;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_> *__range3;
  Columns *columns_local;
  iterator *this_local;
  
  this->m_columns = &columns->m_columns;
  std::
  vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
  ::vector(&this->m_iterators);
  sVar2 = std::
          vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::
          size(this->m_columns);
  this->m_activeIterators = sVar2;
  sVar2 = std::
          vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::
          size(this->m_columns);
  std::
  vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
  ::reserve(&this->m_iterators,sVar2);
  this_00 = this->m_columns;
  __end3 = std::
           vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::
           begin(this_00);
  col = (Column *)
        std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
        ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_Catch::clara::TextFlow::Column_*,_std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>_>
                                *)&col);
    if (!bVar1) break;
    local_48 = __gnu_cxx::
               __normal_iterator<const_Catch::clara::TextFlow::Column_*,_std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>_>
               ::operator*(&__end3);
    Column::begin(&local_78,local_48);
    std::
    vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
    ::push_back(&this->m_iterators,&local_78);
    __gnu_cxx::
    __normal_iterator<const_Catch::clara::TextFlow::Column_*,_std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>_>
    ::operator++(&__end3);
  }
  return;
}

Assistant:

explicit iterator(Columns const& columns)
			: m_columns(columns.m_columns),
			m_activeIterators(m_columns.size()) {
			m_iterators.reserve(m_columns.size());

			for (auto const& col : m_columns)
				m_iterators.push_back(col.begin());
		}